

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<double,double,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool,false,false>
               (double *ldata,double *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  double input;
  double input_00;
  unsigned_long *puVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      ExecuteFlatLoop<double,double,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool,false,false>
                ();
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar4 = 0;
    uVar6 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar5 = 0xffffffffffffffff;
      }
      else {
        uVar5 = puVar1[uVar4];
      }
      uVar7 = uVar6 + 0x40;
      if (count <= uVar6 + 0x40) {
        uVar7 = count;
      }
      uVar8 = uVar7;
      if (uVar5 != 0) {
        uVar8 = uVar6;
        if (uVar5 == 0xffffffffffffffff) {
          if (uVar6 < uVar7) {
            do {
              input = ldata[uVar6];
              input_00 = rdata[uVar6];
              bVar2 = Value::IsNan<double>(input);
              bVar3 = Value::IsNan<double>(input_00);
              if (!bVar3) {
                bVar2 = bVar2 || input_00 <= input;
              }
              result_data[uVar6] = bVar2;
              uVar6 = uVar6 + 1;
              uVar8 = uVar6;
            } while (uVar7 != uVar6);
          }
        }
        else if (uVar6 < uVar7) {
          uVar8 = 0;
          do {
            if ((uVar5 >> (uVar8 & 0x3f) & 1) != 0) {
              ExecuteFlatLoop<double,double,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool,false,false>
                        ();
            }
            uVar8 = uVar8 + 1;
          } while ((uVar6 - uVar7) + uVar8 != 0);
          uVar8 = uVar6 + uVar8;
        }
      }
      uVar4 = uVar4 + 1;
      uVar6 = uVar8;
    } while (uVar4 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}